

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

_Bool duckdb_je_tcache_boot(tsdn_t *tsdn,base_t *base)

{
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  cache_bin_info_t *info;
  uint uVar5;
  uint32_t *puVar6;
  szind_t i;
  ulong uVar7;
  
  if (duckdb_je_opt_tcache_max < 0x1001) {
    duckdb_je_global_do_not_change_tcache_maxclass =
         duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[duckdb_je_opt_tcache_max + 7 >> 3]]
    ;
  }
  else if (duckdb_je_opt_tcache_max < 0x7000000000000001) {
    uVar7 = duckdb_je_opt_tcache_max * 2 - 1;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar7 = 0xf;
    if (6 < (uint)lVar1) {
      uVar7 = ~(-1L << ((char)lVar1 - 3U & 0x3f));
    }
    duckdb_je_global_do_not_change_tcache_maxclass = ~uVar7 & duckdb_je_opt_tcache_max + uVar7;
  }
  else {
    duckdb_je_global_do_not_change_tcache_maxclass = 0;
  }
  if (duckdb_je_global_do_not_change_tcache_maxclass < 0x1001) {
    uVar4 = (uint)duckdb_je_sz_size2index_tab
                  [duckdb_je_global_do_not_change_tcache_maxclass + 7 >> 3];
  }
  else {
    uVar4 = sz_size2index_compute(duckdb_je_global_do_not_change_tcache_maxclass);
  }
  duckdb_je_global_do_not_change_tcache_nbins = uVar4 + 1;
  puVar6 = &duckdb_je_bin_infos[0].nregs;
  info = opt_tcache_ncached_max;
  uVar7 = 0;
  do {
    if (opt_tcache_ncached_max_set[uVar7] == true) {
      uVar4 = (uint)info->ncached_max;
    }
    else {
      uVar4 = duckdb_je_opt_tcache_nslots_large;
      if (uVar7 < 0x24) {
        uVar5 = duckdb_je_opt_tcache_nslots_small_max;
        if (0x1ffe < duckdb_je_opt_tcache_nslots_small_max) {
          uVar5 = 0x1fff;
        }
        uVar5 = uVar5 & 0x1ffe;
        uVar4 = uVar5;
        if (uVar5 < 3) {
          uVar4 = 2;
        }
        uVar3 = (duckdb_je_opt_tcache_nslots_small_min & 1) + duckdb_je_opt_tcache_nslots_small_min;
        if (uVar3 <= uVar4) {
          uVar5 = uVar3;
        }
        if (uVar5 < 3) {
          uVar5 = 2;
        }
        uVar3 = *puVar6 << ((byte)duckdb_je_opt_lg_tcache_nslots_mul & 0x1f);
        if (duckdb_je_opt_lg_tcache_nslots_mul < 0) {
          uVar3 = *puVar6 >> (-(byte)duckdb_je_opt_lg_tcache_nslots_mul & 0x1f);
        }
        uVar3 = (uVar3 & 1) + uVar3;
        if (uVar3 < uVar4) {
          uVar4 = uVar3;
        }
        if (uVar3 <= uVar5) {
          uVar4 = uVar5;
        }
      }
    }
    duckdb_je_cache_bin_info_init(info,(cache_bin_sz_t)uVar4);
    uVar7 = uVar7 + 1;
    info = info + 1;
    puVar6 = puVar6 + 10;
  } while (uVar7 != 0x49);
  _Var2 = duckdb_je_malloc_mutex_init
                    (&tcaches_mtx,"tcaches",WITNESS_RANK_TCACHES,malloc_mutex_rank_exclusive);
  return _Var2;
}

Assistant:

bool
tcache_boot(tsdn_t *tsdn, base_t *base) {
	global_do_not_change_tcache_maxclass = sz_s2u(opt_tcache_max);
	assert(global_do_not_change_tcache_maxclass <= TCACHE_MAXCLASS_LIMIT);
	global_do_not_change_tcache_nbins =
	    sz_size2index(global_do_not_change_tcache_maxclass) + 1;
	/*
	 * Pre-compute default bin info and store the results in
	 * opt_tcache_ncached_max. After the changes here,
	 * opt_tcache_ncached_max should not be modified and should always be
	 * accessed using tcache_get_default_ncached_max.
	 */
	tcache_bin_info_compute(opt_tcache_ncached_max);

	if (malloc_mutex_init(&tcaches_mtx, "tcaches", WITNESS_RANK_TCACHES,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}

	return false;
}